

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoundMap.cpp
# Opt level: O1

vector<AI::SoundWave,_std::allocator<AI::SoundWave>_> * __thiscall
AI::SoundMap::collectSounds
          (vector<AI::SoundWave,_std::allocator<AI::SoundWave>_> *__return_storage_ptr__,
          SoundMap *this,Vector2<float> position,int range)

{
  iterator __position;
  pointer pSVar1;
  Vector2<float> VVar2;
  AuditoryTag AVar3;
  Vector2<int> VVar4;
  __normal_iterator<AI::SoundWave_*,_std::vector<AI::SoundWave,_std::allocator<AI::SoundWave>_>_>
  _Var5;
  pointer pSVar6;
  ulong uVar7;
  SoundWave *pSVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  
  (__return_storage_ptr__->super__Vector_base<AI::SoundWave,_std::allocator<AI::SoundWave>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<AI::SoundWave,_std::allocator<AI::SoundWave>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<AI::SoundWave,_std::allocator<AI::SoundWave>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  VVar4 = calcGridCoordinates(position,this->resolution,this->gridSize);
  iVar10 = range / 2;
  fVar14 = Math::clamp((float)(VVar4.x - iVar10),0.0,(float)(this->gridSize).x);
  fVar15 = Math::clamp((float)(iVar10 + VVar4.x),0.0,(float)(this->gridSize).x);
  fVar16 = Math::clamp((float)(VVar4.y - iVar10),0.0,(float)(this->gridSize).y);
  fVar17 = Math::clamp((float)(iVar10 + VVar4.y),0.0,(float)(this->gridSize).y);
  if ((float)(int)fVar16 < fVar17) {
    iVar9 = (int)fVar16;
    lVar11 = (long)(int)fVar14;
    iVar10 = (int)fVar14;
    do {
      while ((float)iVar10 < fVar15) {
        iVar10 = (this->gridSize).x * iVar9;
        lVar12 = (long)(this->grid).super__Vector_base<AI::Cell,_std::allocator<AI::Cell>_>._M_impl.
                       super__Vector_impl_data._M_start[iVar10 + (int)lVar11].numberOfWaves;
        if (0 < lVar12) {
          lVar13 = (iVar10 + lVar11) * 0x13c + 4;
          do {
            pSVar8 = (SoundWave *)
                     ((long)((this->grid).super__Vector_base<AI::Cell,_std::allocator<AI::Cell>_>.
                             _M_impl.super__Vector_impl_data._M_start)->intersectingWaves +
                     lVar13 + -4);
            __position._M_current =
                 (__return_storage_ptr__->
                 super__Vector_base<AI::SoundWave,_std::allocator<AI::SoundWave>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (__return_storage_ptr__->
                super__Vector_base<AI::SoundWave,_std::allocator<AI::SoundWave>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<AI::SoundWave,std::allocator<AI::SoundWave>>::
              _M_realloc_insert<AI::SoundWave_const&>
                        ((vector<AI::SoundWave,std::allocator<AI::SoundWave>> *)
                         __return_storage_ptr__,__position,pSVar8);
            }
            else {
              VVar4 = pSVar8->gridCoordinates;
              VVar2 = pSVar8->originalPosition;
              fVar16 = pSVar8->intensity;
              AVar3 = pSVar8->tag;
              *(undefined8 *)&((__position._M_current)->originalPosition).y =
                   *(undefined8 *)&(pSVar8->originalPosition).y;
              (__position._M_current)->intensity = fVar16;
              (__position._M_current)->tag = AVar3;
              (__position._M_current)->gridCoordinates = VVar4;
              (__position._M_current)->originalPosition = VVar2;
              (__return_storage_ptr__->
              super__Vector_base<AI::SoundWave,_std::allocator<AI::SoundWave>_>)._M_impl.
              super__Vector_impl_data._M_finish = __position._M_current + 1;
            }
            lVar13 = lVar13 + 0x1c;
            lVar12 = lVar12 + -1;
          } while (lVar12 != 0);
        }
        lVar11 = lVar11 + 1;
        iVar10 = (int)lVar11;
      }
      iVar9 = iVar9 + 1;
      lVar11 = (long)(int)fVar14;
      iVar10 = (int)fVar14;
    } while ((float)iVar9 < fVar17);
  }
  pSVar1 = (__return_storage_ptr__->
           super__Vector_base<AI::SoundWave,_std::allocator<AI::SoundWave>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pSVar6 = (__return_storage_ptr__->
           super__Vector_base<AI::SoundWave,_std::allocator<AI::SoundWave>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pSVar1 != pSVar6) {
    uVar7 = ((long)pSVar6 - (long)pSVar1 >> 2) * 0x6db6db6db6db6db7;
    lVar11 = 0x3f;
    if (uVar7 != 0) {
      for (; uVar7 >> lVar11 == 0; lVar11 = lVar11 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<AI::SoundWave*,std::vector<AI::SoundWave,std::allocator<AI::SoundWave>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (pSVar1,pSVar6,((uint)lVar11 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<AI::SoundWave*,std::vector<AI::SoundWave,std::allocator<AI::SoundWave>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pSVar1,pSVar6);
  }
  _Var5 = std::
          __unique<__gnu_cxx::__normal_iterator<AI::SoundWave*,std::vector<AI::SoundWave,std::allocator<AI::SoundWave>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                    ((__return_storage_ptr__->
                     super__Vector_base<AI::SoundWave,_std::allocator<AI::SoundWave>_>)._M_impl.
                     super__Vector_impl_data._M_start,
                     (__return_storage_ptr__->
                     super__Vector_base<AI::SoundWave,_std::allocator<AI::SoundWave>_>)._M_impl.
                     super__Vector_impl_data._M_finish);
  pSVar8 = (__return_storage_ptr__->
           super__Vector_base<AI::SoundWave,_std::allocator<AI::SoundWave>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if ((_Var5._M_current != pSVar8) &&
     (pSVar1 = (__return_storage_ptr__->
               super__Vector_base<AI::SoundWave,_std::allocator<AI::SoundWave>_>)._M_impl.
               super__Vector_impl_data._M_finish,
     pSVar6 = (pointer)((long)_Var5._M_current + ((long)pSVar1 - (long)pSVar8)), pSVar1 != pSVar6))
  {
    (__return_storage_ptr__->super__Vector_base<AI::SoundWave,_std::allocator<AI::SoundWave>_>).
    _M_impl.super__Vector_impl_data._M_finish = pSVar6;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<SoundWave> SoundMap::collectSounds(Math::Vector2<float> position, int range) const
	{
		std::vector<SoundWave> waves;
		
		auto gridCoordinates = calcGridCoordinates(position, resolution, gridSize);

		auto minX = clamp(gridCoordinates.x - range / 2, 0, gridSize.x);
		auto maxX = clamp(gridCoordinates.x + range / 2, 0, gridSize.x);
		auto minY = clamp(gridCoordinates.y - range / 2, 0, gridSize.y);
		auto maxY = clamp(gridCoordinates.y + range / 2, 0, gridSize.y);

		for (int j = minY; j < maxY; j++)
		{
			for (int i = minX; i < maxX; i++)
			{
				auto index = i + j * gridSize.x;
				auto count = grid[index].numberOfWaves;

				for (int k = 0; k < count; k++)
				{
					waves.push_back(grid[index].intersectingWaves[k]);
				}
			}
		}

		std::sort(begin(waves), end(waves));
		waves.erase(std::unique(begin(waves), end(waves)), end(waves));

		return waves;
	}